

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
vo::Image<unsigned_short>::CopyFrom(Image<unsigned_short> *this,Image<unsigned_short> *img)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((this->ptr != (unsigned_short *)0x0) && (img->ptr != (unsigned_short *)0x0)) {
    uVar1 = img->w;
    if (this->w < img->w) {
      uVar1 = this->w;
    }
    uVar2 = img->h;
    if (this->h < img->h) {
      uVar2 = this->h;
    }
    PitchedCopy((char *)this->ptr,(uint)this->pitch,(char *)img->ptr,(uint)img->pitch,(int)uVar1 * 2
                ,(uint)uVar2);
    return;
  }
  return;
}

Assistant:

inline void CopyFrom(const Image<T>& img) {
    if (IsValid() && img.IsValid()) {
      PitchedCopy((char*)ptr, pitch, (char*)img.ptr, img.pitch,
                  std::min(img.w, w) * sizeof(T), std::min(img.h, h));
    } else if (img.IsValid() != IsValid()) {
    }
  }